

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

int lua_getmetatable(lua_State *L,int objindex)

{
  StkId pSVar1;
  byte bVar2;
  TValue *pTVar3;
  Table *x_;
  TValue *io;
  Table *pTStack_28;
  int res;
  Table *mt;
  TValue *obj;
  int objindex_local;
  lua_State *L_local;
  
  pTVar3 = index2value(L,objindex);
  bVar2 = pTVar3->tt_ & 0xf;
  if (bVar2 == 5) {
    pTStack_28 = *(Table **)((pTVar3->value_).f + 0x20);
  }
  else if (bVar2 == 7) {
    pTStack_28 = *(Table **)((pTVar3->value_).f + 0x18);
  }
  else {
    pTStack_28 = L->l_G->mt[(int)(pTVar3->tt_ & 0xf)];
  }
  if (pTStack_28 != (Table *)0x0) {
    pSVar1 = (L->top).p;
    (pSVar1->val).value_.gc = (GCObject *)pTStack_28;
    (pSVar1->val).tt_ = 'E';
    (L->top).p = (StkId)((L->top).offset + 0x10);
  }
  io._4_4_ = (uint)(pTStack_28 != (Table *)0x0);
  return io._4_4_;
}

Assistant:

LUA_API int lua_getmetatable (lua_State *L, int objindex) {
  const TValue *obj;
  Table *mt;
  int res = 0;
  lua_lock(L);
  obj = index2value(L, objindex);
  switch (ttype(obj)) {
    case LUA_TTABLE:
      mt = hvalue(obj)->metatable;
      break;
    case LUA_TUSERDATA:
      mt = uvalue(obj)->metatable;
      break;
    default:
      mt = G(L)->mt[ttype(obj)];
      break;
  }
  if (mt != NULL) {
    sethvalue2s(L, L->top.p, mt);
    api_incr_top(L);
    res = 1;
  }
  lua_unlock(L);
  return res;
}